

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall
CVmObjByteArray::getp_subarray
          (CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  ulong uVar5;
  ulong ele_count;
  ulong src_idx;
  bool bVar6;
  
  if (in_argc == (uint *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = 1 < *in_argc;
  }
  if ((getp_subarray(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar3 = __cxa_guard_acquire(&getp_subarray(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar3 != 0)) {
    getp_subarray::desc.min_argc_ = 1;
    getp_subarray::desc.opt_argc_ = 1;
    getp_subarray::desc.varargs_ = 0;
    __cxa_guard_release(&getp_subarray(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_subarray::desc);
  if (iVar3 == 0) {
    iVar3 = CVmBif::pop_int_val();
    if (iVar3 == 0) {
      src_idx = 1;
    }
    else {
      src_idx = (ulong)*(uint *)(this->super_CVmObject).ext_ + 1;
      if ((ulong)(long)iVar3 <= src_idx) {
        src_idx = (long)iVar3;
      }
    }
    if (bVar6) {
      iVar3 = CVmBif::pop_int_val();
      uVar5 = (ulong)*(uint *)(this->super_CVmObject).ext_;
      ele_count = (long)iVar3;
    }
    else {
      uVar5 = (ulong)*(uint *)(this->super_CVmObject).ext_;
      ele_count = uVar5;
    }
    pvVar2 = sp_;
    if (uVar5 < src_idx) {
      ele_count = 0;
    }
    else if (uVar5 < (src_idx + ele_count) - 1) {
      ele_count = (uVar5 - src_idx) + 1;
    }
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    vVar4 = create(0,ele_count);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar4;
    copy_from((CVmObjByteArray *)(G_obj_table_X.pages_[vVar4 >> 0xc] + (vVar4 & 0xfff)),1,this,
              src_idx,ele_count);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_subarray(VMG_ vm_obj_id_t self,
                                   vm_val_t *retval, uint *in_argc)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    unsigned long idx;
    unsigned long cnt;
    CVmObjByteArray *arr;
    
    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the starting index */
    idx = CVmBif::pop_int_val(vmg0_);

    /* force it to be in range */
    if (idx < 1)
        idx = 1;
    else if (idx > get_element_count() + 1)
        idx = get_element_count() + 1;

    /* if there's a count, get it */
    if (argc >= 2)
    {
        /* get the explicit count */
        cnt = CVmBif::pop_int_val(vmg0_);
    }
    else
    {
        /* use the entire rest of the array */
        cnt = get_element_count();
    }

    /* limit the count to the available size */
    if (idx > get_element_count())
        cnt = 0;
    else if (idx + cnt - 1 > get_element_count())
        cnt = get_element_count() + 1 - idx;

    /* push a self-reference while we're working for gc protection */
    G_stk->push()->set_obj(self);

    /* allocate a new array to hold the result */
    retval->set_obj(create(vmg_ FALSE, cnt));
    arr = (CVmObjByteArray *)vm_objp(vmg_ retval->val.obj);

    /* copy the data from our array into the new one */
    arr->copy_from(1, this, idx, cnt);

    /* discard our self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}